

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O1

ssize_t __thiscall
event_track::EventSample::write(EventSample *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  pointer pEVar2;
  ssize_t sVar3;
  void *__n_00;
  void *pvVar4;
  undefined4 in_register_00000034;
  undefined8 *puVar5;
  ssize_t sVar6;
  bool bVar7;
  
  if ((this->is_emeb_ == false) &&
     ((this->instance_boxes_).
      super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->instance_boxes_).
      super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    pEVar2 = (this->instance_boxes_).
             super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->instance_boxes_).
        super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
        ._M_impl.super__Vector_impl_data._M_finish == pEVar2) {
      sVar6 = 0;
    }
    else {
      sVar6 = 0;
      __n_00 = (void *)0x0;
      pvVar4 = (void *)0x1;
      do {
        sVar3 = EventMessageInstanceBox::write(pEVar2 + (long)__n_00,__fd,__buf,(size_t)__n_00);
        sVar6 = sVar6 + sVar3;
        pEVar2 = (this->instance_boxes_).
                 super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __buf = (void *)(((long)(this->instance_boxes_).
                                super__Vector_base<event_track::EventMessageInstanceBox,_std::allocator<event_track::EventMessageInstanceBox>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 3) *
                        -0x7b425ed097b425ed);
        bVar7 = pvVar4 <= __buf;
        lVar1 = (long)__buf - (long)pvVar4;
        __n_00 = pvVar4;
        pvVar4 = (void *)(ulong)((int)pvVar4 + 1);
      } while (bVar7 && lVar1 != 0);
    }
  }
  else {
    puVar5 = &emeb;
    if (this->is_vtt_ != false) {
      puVar5 = &vtte;
    }
    sVar6 = 8;
    std::ostream::write((char *)CONCAT44(in_register_00000034,__fd),(long)puVar5);
  }
  return sVar6;
}

Assistant:

size_t write(std::ostream &ostr)
		{
			if (is_emeb_ || instance_boxes_.size() == 0) 
			{
				if (!is_vtt_)
				    ostr.write((const char *)&emeb[0], 8);
				else
					ostr.write((const char*)&vtte[0], 8);
				return 8;
			}
			else 
			{
				size_t t_size = 0;
				for (unsigned int y = 0; y < instance_boxes_.size(); y++)
					t_size+=instance_boxes_[y].write(ostr);
				return t_size;
			}
		}